

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

long gmlc::utilities::numeric_conversionComplete<long>(string_view V,long defValue)

{
  string_view V_00;
  string_view V_01;
  bool bVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  const_reference pvVar5;
  long in_RDX;
  invalid_argument *anon_var_0;
  long res;
  size_t rem;
  size_t in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  size_type sVar6;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  long local_40;
  size_type local_38;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  long local_8;
  
  V_00._M_str = (char *)in_stack_ffffffffffffff80;
  V_00._M_len = in_stack_ffffffffffffff78;
  bVar1 = nonNumericFirstOrLastCharacter(V_00);
  local_8 = in_RDX;
  if (!bVar1) {
    V_01._M_str = in_stack_ffffffffffffff90;
    V_01._M_len = in_stack_ffffffffffffff88;
    lVar3 = numConvComp<long>(V_01,in_stack_ffffffffffffff80);
    while (sVar6 = local_38,
          sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18),
          local_40 = lVar3, sVar6 < sVar4) {
      pvVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_18,local_38);
      iVar2 = isspace((int)*pvVar5);
      local_40 = in_RDX;
      if (iVar2 == 0) break;
      local_38 = local_38 + 1;
    }
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

X numeric_conversionComplete(std::string_view V, const X defValue)
{
    if (nonNumericFirstOrLastCharacter(V)) {
        return defValue;
    }
    try {
        size_t rem;
        X res = numConvComp<X>(V, rem);
        while (rem < V.length()) {
            if (!(isspace(V[rem]))) {
                res = defValue;
                break;
            }
            ++rem;
        }
        return res;
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}